

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O2

oonf_layer2_neighbor_address *
oonf_layer2_neigh_add_ip(oonf_layer2_neigh *l2neigh,oonf_layer2_origin *origin,netaddr *ip)

{
  avl_node *paVar1;
  oonf_layer2_neighbor_address *ptr;
  
  paVar1 = avl_find(&l2neigh->remote_neighbor_ips,ip);
  if (paVar1 == (avl_node *)0x0) {
    ptr = (oonf_layer2_neighbor_address *)oonf_class_malloc(&_l2neigh_addr_class);
    if (ptr == (oonf_layer2_neighbor_address *)0x0) {
      ptr = (oonf_layer2_neighbor_address *)0x0;
    }
    else {
      *(undefined2 *)&(ptr->ip)._type = *(undefined2 *)&ip->_type;
      paVar1 = *(avl_node **)(ip->_addr + 8);
      *(avl_node **)(ptr->ip)._addr = *(avl_node **)ip->_addr;
      *(avl_node **)((long)(ptr->ip)._addr + 8) = paVar1;
      ptr->l2neigh = l2neigh;
      (ptr->_neigh_node).key = ptr;
      avl_insert(&l2neigh->remote_neighbor_ips,&ptr->_neigh_node);
      (ptr->_net_node).key = ptr;
      avl_insert(&l2neigh->network->remote_neighbor_ips,&ptr->_net_node);
      ptr->origin = origin;
      oonf_class_event(&_l2neigh_addr_class,ptr,OONF_OBJECT_ADDED);
    }
  }
  else {
    ptr = (oonf_layer2_neighbor_address *)&paVar1[-2].parent;
    *(oonf_layer2_origin **)&paVar1[-2].balance = origin;
  }
  return ptr;
}

Assistant:

struct oonf_layer2_neighbor_address *
oonf_layer2_neigh_add_ip(
  struct oonf_layer2_neigh *l2neigh, const struct oonf_layer2_origin *origin, const struct netaddr *ip) {
  struct oonf_layer2_neighbor_address *l2addr;

  l2addr = oonf_layer2_neigh_get_remote_ip(l2neigh, ip);
  if (l2addr) {
    l2addr->origin = origin;
    return l2addr;
  }

  l2addr = oonf_class_malloc(&_l2neigh_addr_class);
  if (!l2addr) {
    return NULL;
  }

  /* copy data */
  memcpy(&l2addr->ip, ip, sizeof(*ip));

  /* set back reference */
  l2addr->l2neigh = l2neigh;

  /* add to tree */
  l2addr->_neigh_node.key = &l2addr->ip;
  avl_insert(&l2neigh->remote_neighbor_ips, &l2addr->_neigh_node);
  l2addr->_net_node.key = &l2addr->ip;
  avl_insert(&l2neigh->network->remote_neighbor_ips, &l2addr->_net_node);

  /* remember originator */
  l2addr->origin = origin;

  oonf_class_event(&_l2neigh_addr_class, l2addr, OONF_OBJECT_ADDED);
  return l2addr;
}